

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix * __thiscall maths::Matrix::operator=(Matrix *this,Matrix *m)

{
  uint uVar1;
  double **ppdVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  if (this != m) {
    uVar7 = this->rows_;
    if ((uVar7 != m->rows_) || (this->cols_ != m->cols_)) {
      if (0 < (int)uVar7) {
        lVar10 = 0;
        do {
          if (this->p[lVar10] != (double *)0x0) {
            operator_delete__(this->p[lVar10]);
            uVar7 = this->rows_;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar7);
      }
      if (this->p != (double **)0x0) {
        operator_delete__(this->p);
      }
      iVar6 = m->cols_;
      this->rows_ = m->rows_;
      this->cols_ = iVar6;
      allocSpace(this);
      uVar7 = this->rows_;
    }
    if (0 < (int)uVar7) {
      uVar1 = this->cols_;
      ppdVar2 = m->p;
      ppdVar3 = this->p;
      uVar8 = 0;
      do {
        if (0 < (int)uVar1) {
          pdVar4 = ppdVar2[uVar8];
          pdVar5 = ppdVar3[uVar8];
          uVar9 = 0;
          do {
            pdVar5[uVar9] = pdVar4[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar7);
    }
  }
  return this;
}

Assistant:

Matrix& Matrix::operator=(const Matrix& m)
{

    if (this == &m) {
        return *this;
    }

    if (rows_ != m.rows_ || cols_ != m.cols_) {
        for (int i = 0; i < rows_; ++i) {
            delete[] p[i];
        }
        delete[] p;

        rows_ = m.rows_;
        cols_ = m.cols_;
        allocSpace();
    }

    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] = m.p[i][j];
        }
    }
    return *this;
}